

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.cpp
# Opt level: O2

void * QArrayData::allocate1(QArrayData **dptr,qsizetype capacity,AllocationOption option)

{
  AllocationResult AVar1;
  
  AVar1 = allocateHelper(1,0x10,capacity,option);
  *dptr = AVar1.header;
  return AVar1.data;
}

Assistant:

void *QArrayData::allocate1(QArrayData **dptr, qsizetype capacity, AllocationOption option) noexcept
{
    Q_ASSERT(dptr);

    auto r = allocateHelper(1, alignof(AlignedQArrayData), capacity, option);
    *dptr = r.header;
    return r.data;
}